

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O1

bool __thiscall
crnlib::dynamic_string::expand_buf(dynamic_string *this,uint new_buf_size,bool preserve_contents)

{
  ushort uVar1;
  void *pvVar2;
  uint uVar3;
  char *__src;
  char *pcVar4;
  uint uVar5;
  
  uVar1 = this->m_buf_size;
  if (new_buf_size < uVar1) {
    new_buf_size = (uint)uVar1;
  }
  uVar3 = new_buf_size - 1 >> 0x10 | new_buf_size - 1;
  uVar3 = uVar3 >> 8 | uVar3;
  uVar3 = uVar3 >> 4 | uVar3;
  uVar3 = uVar3 >> 2 | uVar3;
  uVar3 = (uVar3 >> 1 | uVar3) + 1;
  if (0xfffe < uVar3) {
    uVar3 = 0xffff;
  }
  if (uVar3 != uVar1) {
    uVar5 = uVar3 + (uVar3 == 0);
    pvVar2 = crnlib_malloc((ulong)(uVar5 + 0x10));
    *(uint *)((long)pvVar2 + 0xc) = uVar5;
    *(uint *)((long)pvVar2 + 8) = ~uVar5;
    pcVar4 = this->m_pStr;
    if (preserve_contents) {
      __src = "";
      if (pcVar4 != (char *)0x0) {
        __src = pcVar4;
      }
      memcpy((char *)((long)pvVar2 + 0x10),__src,(ulong)this->m_len + 1);
      pcVar4 = this->m_pStr;
    }
    if ((pcVar4 != (char *)0x0) && ((*(uint *)(pcVar4 + -8) ^ *(uint *)(pcVar4 + -4)) == 0xffffffff)
       ) {
      crnlib_free(pcVar4 + -0x10);
    }
    this->m_pStr = (char *)((long)pvVar2 + 0x10);
    this->m_buf_size = (uint16)uVar3;
  }
  return uVar3 <= this->m_buf_size;
}

Assistant:

bool dynamic_string::expand_buf(uint new_buf_size, bool preserve_contents)
    {
        new_buf_size = math::minimum<uint>(cUINT16_MAX, math::next_pow2(math::maximum<uint>(m_buf_size, new_buf_size)));

        if (new_buf_size != m_buf_size)
        {
            char* p = crnlib_new_array<char>(new_buf_size);

            if (preserve_contents)
            {
                memcpy(p, get_ptr_priv(), m_len + 1);
            }

            crnlib_delete_array(m_pStr);
            m_pStr = p;

            m_buf_size = static_cast<uint16>(new_buf_size);

            if (preserve_contents)
            {
                check();
            }
        }

        return m_buf_size >= new_buf_size;
    }